

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O1

char * telopt(int opt)

{
  if (opt < 0x8a) {
    switch(opt) {
    case 0:
      return "BINARY";
    case 1:
      return "ECHO";
    case 2:
      return "RCP";
    case 3:
      return "SGA";
    case 4:
      return "NAMS";
    case 5:
      return "STATUS";
    case 6:
      return "TM";
    case 7:
      return "RCTE";
    case 8:
      return "NAOL";
    case 9:
      return "NAOP";
    case 10:
      return "NAOCRD";
    case 0xb:
      return "NAOHTS";
    case 0xc:
      return "NAOHTD";
    case 0xd:
      return "NAOFFD";
    case 0xe:
      return "NAOVTS";
    case 0xf:
      return "NAOVTD";
    case 0x10:
      return "NAOLFD";
    case 0x11:
      return "XASCII";
    case 0x12:
      return "LOGOUT";
    case 0x13:
      return "BM";
    case 0x14:
      return "DET";
    case 0x15:
      return "SUPDUP";
    case 0x16:
      return "SUPDUPOUTPUT";
    case 0x17:
      return "SNDLOC";
    case 0x18:
      return "TTYPE";
    case 0x19:
      return "EOR";
    case 0x1a:
      return "TUID";
    case 0x1b:
      return "OUTMRK";
    case 0x1c:
      return "TTYLOC";
    case 0x1d:
      return "3270REGIME";
    case 0x1e:
      return "X3PAD";
    case 0x1f:
      return "NAWS";
    case 0x20:
      return "TSPEED";
    case 0x21:
      return "LFLOW";
    case 0x22:
      return "LINEMODE";
    case 0x23:
      return "XDISPLOC";
    case 0x24:
      return "OLD_ENVIRON";
    case 0x25:
      return "AUTHENTICATION";
    case 0x26:
      return "ENCRYPT";
    case 0x27:
      return "NEW_ENVIRON";
    case 0x28:
      return "TN3270E";
    case 0x29:
      return "XAUTH";
    case 0x2a:
      return "CHARSET";
    case 0x2b:
      return "RSP";
    case 0x2c:
      return "COM_PORT_OPTION";
    case 0x2d:
      return "SLE";
    case 0x2e:
      return "STARTTLS";
    case 0x2f:
      return "KERMIT";
    case 0x30:
      return "SEND_URL";
    case 0x31:
      return "FORWARD_X";
    }
  }
  else if (opt < 0x8c) {
    if (opt == 0x8a) {
      return "PRAGMA_LOGON";
    }
    if (opt == 0x8b) {
      return "SSPI_LOGON";
    }
  }
  else {
    if (opt == 0x8c) {
      return "PRAGMA_HEARTBEAT";
    }
    if (opt == 0xff) {
      return "EXOPL";
    }
  }
  return "<unknown>";
}

Assistant:

static const char *telopt(int opt)
{
#define telnet_str(x,y) case TELOPT_##x: return #x;
    switch (opt) {
        TELOPTS(telnet_str)
      default:
        return "<unknown>";
    }
#undef telnet_str
}